

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::CropResizeLayerParams::Clear(CropResizeLayerParams *this)

{
  (this->targetsize_).current_size_ = 0;
  if (this->mode_ != (SamplingMode *)0x0) {
    (*(this->mode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->mode_ = (SamplingMode *)0x0;
  if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0) {
    (*(this->boxindicesmode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->boxindicesmode_ = (BoxCoordinatesMode *)0x0;
  this->normalizedcoordinates_ = false;
  *(undefined3 *)&this->field_0x39 = 0;
  this->spatialscale_ = 0.0;
  return;
}

Assistant:

void CropResizeLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CropResizeLayerParams)
  targetsize_.Clear();
  if (GetArenaNoVirtual() == NULL && mode_ != NULL) {
    delete mode_;
  }
  mode_ = NULL;
  if (GetArenaNoVirtual() == NULL && boxindicesmode_ != NULL) {
    delete boxindicesmode_;
  }
  boxindicesmode_ = NULL;
  ::memset(&normalizedcoordinates_, 0, reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&normalizedcoordinates_) + sizeof(spatialscale_));
}